

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_0::ReferenceProgram::render
          (ReferenceProgram *this,Surface *target,float x1,float y1,float x2,float y2,
          DrawType drawType)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int y;
  int iVar5;
  int x;
  int iVar6;
  
  if ((int)target - 1U < 2) {
    fVar2 = (float)*(int *)this * 0.5;
    fVar1 = (float)(*(int *)this / 2);
    fVar4 = (float)*(int *)(this + 4) * 0.5;
    fVar3 = (float)(*(int *)(this + 4) / 2);
    for (iVar5 = (int)(y1 * fVar4 + fVar3); iVar6 = (int)(x1 * fVar2 + fVar1),
        iVar5 <= (int)(y2 * fVar4 + fVar3); iVar5 = iVar5 + 1) {
      for (; iVar6 <= (int)(x2 * fVar2 + fVar1); iVar6 = iVar6 + 1) {
        *(undefined4 *)(*(long *)(this + 8) + (long)(*(int *)this * iVar5 + iVar6) * 4) = 0xff7f7f7f
        ;
      }
    }
  }
  return;
}

Assistant:

void ReferenceProgram::render (tcu::Surface* target, float x1, float y1, float x2, float y2, PreservingSwapTest::DrawType drawType)
{
	if (drawType == PreservingSwapTest::DRAWTYPE_GLES2_RENDER || drawType == PreservingSwapTest::DRAWTYPE_GLES2_CLEAR)
	{
		const int ox	= target->getWidth()/2;
		const int oy	= target->getHeight()/2;

		const int px	= target->getWidth();
		const int py	= target->getHeight();

		const int x1i	= (int)((px/2.0) * x1 + ox);
		const int y1i	= (int)((py/2.0) * y1 + oy);

		const int x2i	= (int)((px/2.0) * x2 + ox);
		const int y2i	= (int)((py/2.0) * y2 + oy);

		const tcu::RGBA	color(127, 127, 127, 255);

		for (int y = y1i; y <= y2i; y++)
		{
			for (int x = x1i; x <= x2i; x++)
				target->setPixel(x, y, color);
		}
	}
	else
		DE_ASSERT(false);
}